

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Matrix<float,_2,_4>_> __thiscall
vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  SharedPtrStateBase *extraout_RDX;
  undefined8 *in_RSI;
  ExprP<tcu::Matrix<float,_2,_4>_> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_> local_18;
  
  local_18.m_ptr = (Expr<tcu::Matrix<float,_2,_4>_> *)*in_RSI;
  local_18.m_state = (SharedPtrStateBase *)in_RSI[1];
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  exprP<tcu::Matrix<float,2,4>>((shaderexecutor *)this,&local_18);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>::release(&local_18);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_4>_> *)this;
  return (ExprP<tcu::Matrix<float,_2,_4>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }